

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O0

index_t __thiscall xLearn::DMatrix::max_feat_or_field(DMatrix *this,bool is_feat)

{
  bool bVar1;
  const_reference ppvVar2;
  pointer pNVar3;
  byte in_SIL;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  *in_RDI;
  const_iterator iter;
  SparseRow *sr;
  size_t i;
  index_t max;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_28;
  value_type local_20;
  ulong local_18;
  index_t local_10;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_10 = 0;
  for (local_18 = 0; local_18 < *(uint *)&in_RDI[2]._M_current; local_18 = local_18 + 1) {
    ppvVar2 = std::
              vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ::operator[]((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                            *)(in_RDI + 3),local_18);
    local_20 = *ppvVar2;
    std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin(in_stack_ffffffffffffffb8);
    __gnu_cxx::
    __normal_iterator<xLearn::Node_const*,std::vector<xLearn::Node,std::allocator<xLearn::Node>>>::
    __normal_iterator<xLearn::Node*>
              (in_RDI,(__normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                       *)in_stack_ffffffffffffffb8);
    while( true ) {
      std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end(in_stack_ffffffffffffffb8);
      bVar1 = __gnu_cxx::operator!=
                        (in_RDI,(__normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                                 *)in_stack_ffffffffffffffb8);
      if (!bVar1) break;
      if ((local_9 & 1) == 0) {
        pNVar3 = __gnu_cxx::
                 __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                 ::operator->(&local_28);
        if (local_10 < pNVar3->field_id) {
          pNVar3 = __gnu_cxx::
                   __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                   ::operator->(&local_28);
          local_10 = pNVar3->field_id;
        }
      }
      else {
        pNVar3 = __gnu_cxx::
                 __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                 ::operator->(&local_28);
        if (local_10 < pNVar3->feat_id) {
          pNVar3 = __gnu_cxx::
                   __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                   ::operator->(&local_28);
          local_10 = pNVar3->feat_id;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
      ::operator++(&local_28);
    }
  }
  return local_10;
}

Assistant:

inline index_t max_feat_or_field(bool is_feat) const {
    index_t max = 0;
    for (size_t i = 0; i < row_length; ++i) {
      SparseRow* sr = this->row[i];
      for (SparseRow::const_iterator iter = sr->begin();
           iter != sr->end(); ++iter) {
        if (is_feat) {  // feature
          if (iter->feat_id > max) {
            max = iter->feat_id;
          }
        } else {  // field
          if (iter->field_id > max) {
            max = iter->field_id;
          }
        }
      }
    }
    return max;
  }